

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O3

void __thiscall
duckdb::MergeJoinGlobalState::MergeJoinGlobalState
          (MergeJoinGlobalState *this,ClientContext *context,PhysicalPiecewiseMergeJoin *op)

{
  const_reference pvVar1;
  const_reference this_00;
  GlobalSortedTable *this_01;
  vector<duckdb::BoundOrderByNode,_true> rhs_order;
  RowLayout rhs_layout;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_c8;
  BoundOrderByNode local_b0;
  vector<duckdb::LogicalType,_true> local_98;
  RowLayout local_80;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__MergeJoinGlobalState_01999fe8;
  (this->table).
  super_unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_false>._M_head_impl =
       (GlobalSortedTable *)0x0;
  RowLayout::RowLayout(&local_80);
  pvVar1 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin
                       .super_CachingPhysicalOperator.super_PhysicalOperator.children,1);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_98,
             &(pvVar1->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize(&local_80,&local_98,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_98);
  local_c8.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = vector<duckdb::BoundOrderByNode,_true>::operator[](&op->rhs_orders,0);
  BoundOrderByNode::Copy(&local_b0,this_00);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>(&local_c8,&local_b0);
  if ((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
      local_b0.stats.
      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)0x0) {
    BaseStatistics::~BaseStatistics
              ((BaseStatistics *)
               local_b0.stats.
               super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
               .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
    operator_delete((void *)local_b0.stats.
                            super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                            .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
  }
  local_b0.stats.
  super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
       (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
        )0x0;
  if (local_b0.expression.
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)0x0)
  {
    (*((BaseExpression *)
      local_b0.expression.
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->_vptr_BaseExpression[1])();
  }
  this_01 = (GlobalSortedTable *)operator_new(0x2e0);
  PhysicalRangeJoin::GlobalSortedTable::GlobalSortedTable
            (this_01,context,(vector<duckdb::BoundOrderByNode,_true> *)&local_c8,&local_80,
             (PhysicalOperator *)op);
  ::std::
  __uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ::reset((__uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
           *)&this->table,this_01);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&local_c8);
  if (local_80.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_80);
  return;
}

Assistant:

MergeJoinGlobalState(ClientContext &context, const PhysicalPiecewiseMergeJoin &op) {
		RowLayout rhs_layout;
		rhs_layout.Initialize(op.children[1].get().GetTypes());
		vector<BoundOrderByNode> rhs_order;
		rhs_order.emplace_back(op.rhs_orders[0].Copy());
		table = make_uniq<GlobalSortedTable>(context, rhs_order, rhs_layout, op);
	}